

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QVariant>::copyAppend
          (QGenericArrayOps<QVariant> *this,QVariant *b,QVariant *e)

{
  QVariant *pQVar1;
  qsizetype qVar2;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QVariant>).ptr;
    qVar2 = (this->super_QArrayDataPointer<QVariant>).size;
    do {
      QVariant::QVariant(pQVar1 + qVar2,b);
      b = b + 1;
      qVar2 = (this->super_QArrayDataPointer<QVariant>).size + 1;
      (this->super_QArrayDataPointer<QVariant>).size = qVar2;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }